

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  allocator local_39;
  string local_38;
  
  pcVar2 = *current;
  if ((long)end - (long)pcVar2 < 4) {
    std::__cxx11::string::string
              ((string *)&local_38,"Bad unicode escape sequence in string: four digits expected.",
               &local_39);
    addError(this,&local_38,token,*current);
LAB_0011fa67:
    std::__cxx11::string::~string((string *)&local_38);
    bVar6 = false;
  }
  else {
    *unicode = 0;
    uVar3 = 0;
    iVar4 = 4;
    while( true ) {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) break;
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar5 = (int)cVar1;
      uVar3 = uVar3 * 0x10;
      *unicode = uVar3;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar3 = (uVar3 + iVar5) - 0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar3 = (uVar3 + iVar5) - 0x57;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          std::__cxx11::string::string
                    ((string *)&local_38,
                     "Bad unicode escape sequence in string: hexadecimal digit expected.",&local_39)
          ;
          addError(this,&local_38,token,*current);
          goto LAB_0011fa67;
        }
        uVar3 = (uVar3 + iVar5) - 0x37;
      }
      *unicode = uVar3;
      pcVar2 = pcVar2 + 1;
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  return true;
}